

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  char cVar1;
  pointer pvVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar5 = (ulong)location & 0xfffffff;
  if ((((uVar5 == 0) ||
       (pvVar2 = (this->bufferEntries).
                 super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)(this->bufferEntries).
                     super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 6) <= uVar5)) ||
      (*(__index_type *)
        ((long)&pvVar2[uVar5].
                super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
        + 0x38) != '\0')) ||
     (lVar3 = *(long *)&pvVar2[uVar5].
                        super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        .
                        super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        .
                        super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
     , lVar3 == 0)) {
    sVar6 = 0;
  }
  else {
    sVar4 = 1;
    uVar5 = (ulong)location >> 0x1c;
    do {
      sVar6 = sVar4;
      if ((uVar5 == 0) || (cVar1 = *(char *)(*(long *)(lVar3 + 0x20) + -1 + uVar5), cVar1 == '\r'))
      break;
      sVar4 = sVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (cVar1 != '\n');
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return sVar6;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(location.buffer(), lock);
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    SLANG_ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}